

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract.c
# Opt level: O0

int archive_read_extract(archive *_a,archive_entry *entry,int flags)

{
  archive_entry *entry_00;
  archive *paVar1;
  wchar_t in_EDX;
  archive *in_RDI;
  archive_read *a;
  archive_read_extract *extract;
  archive_read *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  entry_00 = (archive_entry *)__archive_read_get_extract(in_stack_ffffffffffffffc8);
  if (entry_00 == (archive_entry *)0x0) {
    local_4 = -0x1e;
  }
  else {
    if (entry_00->archive == (archive *)0x0) {
      paVar1 = archive_write_disk_new();
      entry_00->archive = paVar1;
      if (entry_00->archive == (archive *)0x0) {
        archive_set_error(in_RDI,0xc,"Can\'t extract");
        return -0x1e;
      }
      archive_write_disk_set_standard_lookup(in_RDI);
      in_RDI[0x15].compression_name = (char *)archive_read_extract_cleanup;
    }
    archive_write_disk_set_options(entry_00->archive,in_EDX);
    local_4 = archive_read_extract2
                        ((archive *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),entry_00,in_RDI);
  }
  return local_4;
}

Assistant:

int
archive_read_extract(struct archive *_a, struct archive_entry *entry, int flags)
{
	struct archive_read_extract *extract;
	struct archive_read * a = (struct archive_read *)_a;

	extract = __archive_read_get_extract(a);
	if (extract == NULL)
		return (ARCHIVE_FATAL);

	/* If we haven't initialized the archive_write_disk object, do it now. */
	if (extract->ad == NULL) {
		extract->ad = archive_write_disk_new();
		if (extract->ad == NULL) {
			archive_set_error(&a->archive, ENOMEM, "Can't extract");
			return (ARCHIVE_FATAL);
		}
		archive_write_disk_set_standard_lookup(extract->ad);
		a->cleanup_archive_extract = archive_read_extract_cleanup;
	}

	archive_write_disk_set_options(extract->ad, flags);
	return (archive_read_extract2(&a->archive, entry, extract->ad));
}